

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O0

PBuffer __thiscall ConvertorPCM2WAV::create_data(ConvertorPCM2WAV *this,PBuffer *data)

{
  shared_ptr<Buffer> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar1;
  PBuffer *data_local;
  ConvertorPCM2WAV *this_local;
  
  std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)this,in_RDX);
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorPCM2WAV::create_data(PBuffer data) {
  return data;
}